

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalNinjaGenerator::ConvertToIncludeReference
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *path,
          OutputFormat format,bool forceFullPaths)

{
  cmOutputConverter *this_00;
  char *pcVar1;
  allocator local_99;
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_25;
  OutputFormat local_24;
  bool forceFullPaths_local;
  string *psStack_20;
  OutputFormat format_local;
  string *path_local;
  cmLocalNinjaGenerator *this_local;
  
  local_25 = forceFullPaths;
  local_24 = format;
  psStack_20 = path;
  path_local = (string *)this;
  this_local = (cmLocalNinjaGenerator *)__return_storage_ptr__;
  if (forceFullPaths) {
    cmsys::SystemTools::CollapseFullPath(&local_48,path);
    cmOutputConverter::ConvertToOutputFormat
              (__return_storage_ptr__,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_48,local_24);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    pcVar1 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,pcVar1,&local_99);
    cmOutputConverter::ConvertToRelativePath(&local_78,this_00,&local_98,psStack_20);
    cmOutputConverter::ConvertToOutputFormat(__return_storage_ptr__,this_00,&local_78,local_24);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::ConvertToIncludeReference(
  std::string const& path, cmOutputConverter::OutputFormat format,
  bool forceFullPaths)
{
  if (forceFullPaths) {
    return this->ConvertToOutputFormat(cmSystemTools::CollapseFullPath(path),
                                       format);
  }
  return this->ConvertToOutputFormat(
    this->ConvertToRelativePath(this->GetBinaryDirectory(), path), format);
}